

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O3

gdImagePtr gdImageScale(gdImagePtr src,uint new_width,uint new_height)

{
  byte bVar1;
  gdInterpolationMethod gVar2;
  int **ppiVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  gdImagePtr pgVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  gdFixed f_dx;
  gdFixed f_dy;
  long dst_h;
  long dst_w;
  uint local_c8 [4];
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_94;
  int local_90;
  int local_8c;
  int **local_80;
  uint local_78 [4];
  uint uStack_68;
  uint uStack_64;
  uint local_60;
  uint uStack_5c;
  uint uStack_58;
  uint uStack_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  if (src == (gdImagePtr)0x0) {
    return (gdImagePtr)0x0;
  }
  gVar2 = src->interpolation_id;
  if (GD_LINEAR < gVar2) {
    return (gdImagePtr)0x0;
  }
  if (new_height == 0 || new_width == 0) {
    return (gdImagePtr)0x0;
  }
  uVar36 = src->sx;
  if ((uVar36 == new_width) && (src->sy == new_height)) {
    pgVar7 = gdImageClone(src);
    return pgVar7;
  }
  if ((int)gVar2 < 0x10) {
    if (gVar2 - GD_BICUBIC < 2) {
      iVar14 = src->sy;
      if (src->trueColor == 0) {
        gdImagePaletteToTrueColor(src);
      }
      pgVar7 = gdImageCreateTrueColor(new_width,new_height);
      if (pgVar7 == (gdImagePtr)0x0) {
        return (gdImagePtr)0x0;
      }
      pgVar7->saveAlphaFlag = 1;
      local_80 = pgVar7->tpixels;
      lVar12 = (long)(int)uVar36 + -1;
      lVar30 = (long)(int)uVar36 + -2;
      ppiVar3 = src->tpixels;
      uVar16 = 0;
      do {
        lVar32 = uVar16 * (long)(((float)iVar14 / (float)new_height) * 256.0) * 0x100;
        lVar33 = lVar32 >> 0x10;
        lVar18 = lVar33 * 0x100 - (lVar32 >> 8);
        piVar4 = local_80[uVar16];
        local_78[0] = (uint)((ulong)lVar32 >> 0x10);
        uVar11 = 0;
        do {
          lVar32 = uVar11 * (long)(((float)(int)uVar36 / (float)new_width) * 256.0) * 0x100;
          lVar24 = lVar32 >> 0x10;
          local_b4 = (int)((ulong)lVar32 >> 0x10);
          local_78[1] = local_78[0];
          local_c8[2] = local_b4;
          local_c8[3] = local_b4;
          if (0 < lVar33) {
            local_c8[2] = (uint)(lVar24 < lVar12) + local_b4;
            if (lVar24 < lVar30) {
              local_c8[3] = local_b4 + 2;
            }
          }
          local_b8 = local_b4 + -1;
          if (lVar24 < 1) {
            local_b8 = local_b4;
          }
          local_b0 = (uint)(lVar24 < lVar12) + local_b4;
          local_ac = local_b4 + 2;
          if (lVar30 <= lVar24) {
            local_ac = local_b4;
          }
          local_a8 = local_b4 + -1;
          if (lVar24 < 1) {
            local_a8 = local_b4;
          }
          local_9c = local_ac;
          if ((long)iVar14 + -1 <= lVar33) {
            local_9c = local_b4;
            local_a8 = local_b4;
          }
          local_78[2] = local_78[0];
          local_78[3] = local_78[0];
          uStack_68 = local_78[0];
          uStack_64 = local_78[0];
          local_a4 = local_b4;
          local_60 = local_78[0];
          uStack_5c = local_78[0];
          uStack_58 = local_78[0];
          uStack_54 = local_78[0];
          local_a0 = (((long)iVar14 + -1 <= lVar33 || lVar12 <= lVar24) ^ 1) + local_b4;
          local_50 = local_78[0];
          local_4c = local_78[0];
          local_48 = local_78[0];
          local_8c = local_b4;
          if (lVar33 < iVar14 + -2) {
            local_94 = local_b4;
            local_44 = local_78[0];
            local_b4 = local_b0;
            local_8c = local_ac;
          }
          lVar24 = lVar24 * 0x100 - (lVar32 >> 8);
          local_90 = local_b4;
          local_40 = local_78[0];
          local_3c = local_78[0];
          lVar26 = -1;
          lVar37 = 0;
          lVar32 = 0;
          lVar31 = 0;
          lVar25 = 0;
          lVar34 = 0;
          do {
            lVar27 = lVar26 * 0x100;
            uVar28 = lVar27 + lVar18;
            if ((long)uVar28 < -0x1ff) {
              uVar15 = 0;
LAB_00119bcc:
              lVar8 = 0;
              uVar19 = 0;
LAB_00119bce:
              uVar28 = 0;
            }
            else {
              lVar8 = uVar28 + 0x200;
              uVar15 = ((ulong)(lVar8 * lVar8) >> 8) * lVar8 >> 8;
              if ((long)uVar28 < -0xff) goto LAB_00119bcc;
              lVar8 = lVar18 + lVar27 + 0x100;
              uVar19 = ((ulong)(lVar8 * lVar8) >> 8) * lVar8 >> 6 & 0x7ffffffffffffc;
              if ((long)uVar28 < 1) {
                lVar8 = 0;
                goto LAB_00119bce;
              }
              lVar8 = ((uVar28 * uVar28 >> 8) * uVar28 >> 7 & 0xfffffffffffffffe) * 3;
              if (uVar28 < 0x101) goto LAB_00119bce;
              lVar27 = lVar18 + lVar27 + -0x100;
              uVar28 = ((ulong)(lVar27 * lVar27) >> 8) * lVar27 >> 6 & 0x7ffffffffffffc;
            }
            lVar9 = ((lVar8 + uVar15) - (uVar19 + uVar28)) * 0x100;
            lVar27 = lVar9 >> 0x3f;
            lVar29 = 0;
            lVar8 = lVar37;
            do {
              uVar28 = (lVar24 + lVar29) - 0x100;
              if ((long)uVar28 < -0x1ff) {
                uVar15 = 0;
LAB_00119cc2:
                lVar10 = 0;
                uVar19 = 0;
LAB_00119cc5:
                uVar28 = 0;
              }
              else {
                lVar10 = lVar24 + lVar29 + 0x100;
                uVar15 = ((ulong)(lVar10 * lVar10) >> 8) * lVar10 >> 8;
                if ((long)uVar28 < -0xff) goto LAB_00119cc2;
                lVar10 = lVar24 + lVar29;
                uVar19 = ((ulong)(lVar10 * lVar10) >> 8) * lVar10 >> 6 & 0x7ffffffffffffc;
                if ((long)uVar28 < 1) {
                  lVar10 = 0;
                  goto LAB_00119cc5;
                }
                lVar10 = ((uVar28 * uVar28 >> 8) * uVar28 >> 7 & 0xfffffffffffffffe) * 3;
                if (uVar28 < 0x101) goto LAB_00119cc5;
                lVar20 = lVar24 + lVar29 + -0x200;
                uVar28 = ((ulong)(lVar20 * lVar20) >> 8) * lVar20 >> 6 & 0x7ffffffffffffc;
              }
              lVar10 = ((long)(((lVar10 + uVar15) - (uVar19 + uVar28)) * 0x100) / 0x600) *
                       ((lVar9 / 6 + lVar27 >> 8) - lVar27) >> 8;
              uVar5 = ppiVar3[*(uint *)((long)local_78 + lVar8)][*(uint *)((long)local_c8 + lVar8)];
              lVar32 = lVar32 + ((long)((ulong)(uVar5 >> 8 & 0xff00) * lVar10) >> 8);
              lVar31 = lVar31 + ((long)((ulong)(uVar5 & 0xff00) * lVar10) >> 8);
              lVar25 = lVar25 + ((long)((ulong)((uVar5 & 0xff) << 8) * lVar10) >> 8);
              lVar34 = lVar34 + ((long)((ulong)(uVar5 >> 0x10 & 0x7f00) * lVar10) >> 8);
              lVar29 = lVar29 + 0x100;
              lVar8 = lVar8 + 4;
            } while (lVar29 != 0x400);
            lVar26 = lVar26 + 1;
            lVar37 = lVar37 + 0x10;
          } while (lVar26 != 3);
          lVar24 = lVar32 * 0x10a >> 0x10;
          uVar5 = 0xff0000;
          if (lVar24 < 0x100) {
            if (lVar24 < 0) {
              uVar5 = 0;
            }
            else {
              uVar5 = ((uint)((ulong)(lVar32 * 0x10a) >> 0x10) & 0xff) << 0x10;
            }
          }
          lVar32 = lVar31 * 0x10a >> 0x10;
          uVar13 = 0xff00;
          if (lVar32 < 0x100) {
            if (lVar32 < 0) {
              uVar13 = 0;
            }
            else {
              uVar13 = ((uint)((ulong)(lVar31 * 0x10a) >> 0x10) & 0xff) << 8;
            }
          }
          lVar32 = lVar25 * 0x10a >> 0x10;
          if (lVar32 < 1) {
            lVar32 = 0;
          }
          if (0xfe < lVar32) {
            lVar32 = 0xff;
          }
          lVar24 = lVar34 * 0x10a >> 0x10;
          uVar22 = 0x7f000000;
          if (lVar24 < 0x80) {
            if (lVar24 < 0) {
              uVar22 = 0;
            }
            else {
              uVar22 = (int)((ulong)(lVar34 * 0x10a) >> 0x10) << 0x18;
            }
          }
          piVar4[uVar11] = uVar5 | (uint)lVar32 | uVar13 | uVar22;
          uVar11 = uVar11 + 1;
        } while (uVar11 != new_width);
        uVar16 = uVar16 + 1;
        if (uVar16 == new_height) {
          return pgVar7;
        }
      } while( true );
    }
    if (gVar2 != GD_BILINEAR_FIXED) {
LAB_0011a2b7:
      if (src->interpolation == (interpolation_method)0x0) {
        return (gdImagePtr)0x0;
      }
      pgVar7 = gdImageScaleTwoPass(src,new_width,new_height);
      return pgVar7;
    }
  }
  else if (gVar2 != GD_LINEAR) {
    if (gVar2 == GD_NEAREST_NEIGHBOUR) {
      pgVar7 = gdImageScaleNearestNeighbour(src,new_width,new_height);
      return pgVar7;
    }
    goto LAB_0011a2b7;
  }
  uVar16 = (ulong)new_width;
  lVar12 = (long)(((float)(int)uVar36 / (float)uVar16) * 256.0);
  uVar11 = (ulong)new_height;
  lVar30 = (long)(((float)src->sy / (float)uVar11) * 256.0);
  if (src->trueColor == 0) {
    uVar36 = src->transparent;
    pgVar7 = gdImageCreateTrueColor(new_width,new_height);
    if (pgVar7 != (gdImagePtr)0x0) {
      if ((int)uVar36 < 0) {
        iVar14 = -1;
      }
      else {
        iVar14 = src->green[uVar36] * 0x100 +
                 src->red[uVar36] * 0x10000 + src->alpha[uVar36] * 0x1000000 + src->blue[uVar36];
      }
      pgVar7->transparent = iVar14;
      uVar28 = 0;
      do {
        lVar32 = uVar28 * lVar30 * 0x100;
        lVar18 = (lVar32 >> 8) + (lVar32 >> 0x10) * -0x100;
        iVar35 = (int)((ulong)lVar32 >> 0x10);
        iVar14 = iVar35 + 1;
        lVar32 = 0;
        uVar15 = 0;
        do {
          iVar17 = (int)((ulong)lVar32 >> 0x10);
          iVar6 = gdImageBoundsSafe(src,iVar17,iVar35);
          uVar36 = 0;
          if ((iVar6 != 0) && (bVar1 = src->pixels[iVar35][iVar17], src->transparent != (uint)bVar1)
             ) {
            uVar36 = src->green[bVar1] * 0x100 +
                     src->red[bVar1] * 0x10000 + src->alpha[bVar1] * 0x1000000 + src->blue[bVar1];
          }
          iVar21 = iVar17 + 1;
          iVar6 = gdImageBoundsSafe(src,iVar21,iVar35);
          uVar5 = uVar36;
          if (iVar6 != 0) {
            bVar1 = src->pixels[iVar35][iVar21];
            if (src->transparent == (uint)bVar1) {
              if (uVar36 == 0xffffffff) {
                uVar5 = 0x7f000000;
              }
            }
            else {
              uVar5 = src->green[bVar1] * 0x100 +
                      src->red[bVar1] * 0x10000 + src->alpha[bVar1] * 0x1000000 + src->blue[bVar1];
            }
          }
          iVar6 = gdImageBoundsSafe(src,iVar17,iVar14);
          uVar19 = (ulong)uVar36;
          if (iVar6 != 0) {
            bVar1 = src->pixels[iVar14][iVar17];
            if (src->transparent == (uint)bVar1) {
              uVar19 = (ulong)uVar36;
              if (uVar36 == 0xffffffff) {
                uVar19 = 0x7f000000;
              }
            }
            else {
              uVar19 = (ulong)(uint)(src->green[bVar1] * 0x100 +
                                     src->red[bVar1] * 0x10000 + src->alpha[bVar1] * 0x1000000 +
                                    src->blue[bVar1]);
            }
          }
          iVar6 = gdImageBoundsSafe(src,iVar21,iVar14);
          uVar38 = (ulong)uVar36;
          if (iVar6 != 0) {
            bVar1 = src->pixels[iVar14][iVar21];
            if (src->transparent == (uint)bVar1) {
              uVar38 = (ulong)uVar36;
              if (uVar36 == 0xffffffff) {
                uVar38 = 0x7f000000;
              }
            }
            else {
              uVar38 = (ulong)(uint)(src->green[bVar1] * 0x100 +
                                     src->red[bVar1] * 0x10000 + src->alpha[bVar1] * 0x1000000 +
                                    src->blue[bVar1]);
            }
          }
          lVar33 = (lVar32 >> 8) + (lVar32 >> 0x10) * -0x100;
          uVar22 = (uint)uVar19;
          uVar13 = (uint)uVar38;
          iVar23 = (int)((ulong)((0x100 - lVar33) * (0x100 - lVar18)) >> 8);
          iVar21 = (int)((ulong)(lVar33 * (0x100 - lVar18)) >> 8);
          iVar17 = (int)((ulong)((0x100 - lVar33) * lVar18) >> 8);
          iVar6 = (int)((ulong)(lVar33 * lVar18) >> 8);
          pgVar7->tpixels[uVar28][uVar15] =
               ((uVar13 & 0xff) * 0x100 * iVar6 >> 8) + ((uVar22 & 0xff) * 0x100 * iVar17 >> 8) +
               ((uVar5 & 0xff) * 0x100 * iVar21 >> 8) + ((uVar36 & 0xff) * 0x100 * iVar23 >> 8) >> 8
               & 0xff | ((uVar13 & 0xff00) * iVar6 >> 8) + ((uVar22 & 0xff00) * iVar17 >> 8) +
                        ((uVar5 & 0xff00) * iVar21 >> 8) + ((uVar36 & 0xff00) * iVar23 >> 8) &
                        0xff00 | ((((uint)(uVar38 >> 8) & 0xff00) * iVar6 >> 8) +
                                  (((uint)(uVar19 >> 8) & 0xff00) * iVar17 >> 8) +
                                  ((uVar5 >> 8 & 0xff00) * iVar21 >> 8) +
                                  ((uVar36 >> 8 & 0xff00) * iVar23 >> 8) & 0xff00) << 8 |
                        (((uVar13 >> 0x10 & 0x7f00) * iVar6 >> 8) +
                         ((uVar22 >> 0x10 & 0x7f00) * iVar17 >> 8) +
                         ((uVar5 >> 0x10 & 0x7f00) * iVar21 >> 8) +
                         ((uVar36 >> 0x10 & 0x7f00) * iVar23 >> 8) & 0xff00) << 0x10;
          uVar15 = uVar15 + 1;
          lVar32 = lVar32 + lVar12 * 0x100;
        } while (uVar16 != uVar15);
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar11);
      return pgVar7;
    }
  }
  else {
    pgVar7 = gdImageCreateTrueColor(new_width,new_height);
    if (pgVar7 != (gdImagePtr)0x0) {
      uVar28 = 0;
      do {
        lVar32 = uVar28 * lVar30 * 0x100;
        lVar18 = (lVar32 >> 8) + (lVar32 >> 0x10) * -0x100;
        iVar35 = (int)((ulong)lVar32 >> 0x10);
        iVar14 = iVar35 + 1;
        lVar32 = 0;
        uVar15 = 0;
        do {
          iVar17 = (int)((ulong)lVar32 >> 0x10);
          iVar6 = gdImageBoundsSafe(src,iVar17,iVar35);
          if (iVar6 == 0) {
            uVar36 = 0;
          }
          else {
            uVar36 = 0;
            if (src->tpixels[iVar35][iVar17] != src->transparent) {
              uVar36 = src->tpixels[iVar35][iVar17];
            }
          }
          iVar21 = iVar17 + 1;
          iVar6 = gdImageBoundsSafe(src,iVar21,iVar35);
          uVar19 = (ulong)uVar36;
          if (iVar6 != 0) {
            uVar19 = 0x7f000000;
            if (uVar36 != 0xffffffff) {
              uVar19 = (ulong)uVar36;
            }
            if (src->tpixels[iVar35][iVar21] != src->transparent) {
              uVar19 = (ulong)(uint)src->tpixels[iVar35][iVar21];
            }
          }
          iVar6 = gdImageBoundsSafe(src,iVar17,iVar14);
          uVar38 = (ulong)uVar36;
          if (iVar6 != 0) {
            uVar38 = 0x7f000000;
            if (uVar36 != 0xffffffff) {
              uVar38 = (ulong)uVar36;
            }
            if (src->tpixels[iVar14][iVar17] != src->transparent) {
              uVar38 = (ulong)(uint)src->tpixels[iVar14][iVar17];
            }
          }
          iVar6 = gdImageBoundsSafe(src,iVar21,iVar14);
          uVar5 = uVar36;
          if (iVar6 != 0) {
            uVar5 = 0x7f000000;
            if (uVar36 != 0xffffffff) {
              uVar5 = uVar36;
            }
            if (src->tpixels[iVar14][iVar21] != src->transparent) {
              uVar5 = src->tpixels[iVar14][iVar21];
            }
          }
          lVar33 = (lVar32 >> 8) + (lVar32 >> 0x10) * -0x100;
          uVar13 = (uint)uVar19;
          uVar22 = (uint)uVar38;
          iVar23 = (int)((ulong)((0x100 - lVar33) * (0x100 - lVar18)) >> 8);
          iVar21 = (int)((ulong)(lVar33 * (0x100 - lVar18)) >> 8);
          iVar17 = (int)((ulong)((0x100 - lVar33) * lVar18) >> 8);
          iVar6 = (int)((ulong)(lVar33 * lVar18) >> 8);
          pgVar7->tpixels[uVar28][uVar15] =
               ((uVar5 & 0xff) * 0x100 * iVar6 >> 8) + ((uVar22 & 0xff) * 0x100 * iVar17 >> 8) +
               ((uVar13 & 0xff) * 0x100 * iVar21 >> 8) + ((uVar36 & 0xff) * 0x100 * iVar23 >> 8) >>
               8 & 0xff |
               ((uVar5 & 0xff00) * iVar6 >> 8) + ((uVar22 & 0xff00) * iVar17 >> 8) +
               ((uVar13 & 0xff00) * iVar21 >> 8) + ((uVar36 & 0xff00) * iVar23 >> 8) & 0xff00 |
               (((uVar5 >> 8 & 0xff00) * iVar6 >> 8) +
                (((uint)(uVar38 >> 8) & 0xff00) * iVar17 >> 8) +
                (((uint)(uVar19 >> 8) & 0xff00) * iVar21 >> 8) +
                ((uVar36 >> 8 & 0xff00) * iVar23 >> 8) & 0xff00) << 8 |
               (((uVar5 >> 0x10 & 0x7f00) * iVar6 >> 8) + ((uVar22 >> 0x10 & 0x7f00) * iVar17 >> 8)
                + ((uVar13 >> 0x10 & 0x7f00) * iVar21 >> 8) +
                  ((uVar36 >> 0x10 & 0x7f00) * iVar23 >> 8) & 0xff00) << 0x10;
          uVar15 = uVar15 + 1;
          lVar32 = lVar32 + lVar12 * 0x100;
        } while (uVar16 != uVar15);
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar11);
      return pgVar7;
    }
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageScale(const gdImagePtr src, const unsigned int new_width, const unsigned int new_height)
{
	gdImagePtr im_scaled = NULL;

	if (src == NULL || (uintmax_t)src->interpolation_id >= GD_METHOD_COUNT) {
		return NULL;
	}

	if (new_width == 0 || new_height == 0) {
		return NULL;
	}
	if (new_width == gdImageSX(src) && new_height == gdImageSY(src)) {
		return gdImageClone(src);
	}
	switch (src->interpolation_id) {
		/*Special cases, optimized implementations */
		case GD_NEAREST_NEIGHBOUR:
			im_scaled = gdImageScaleNearestNeighbour(src, new_width, new_height);
			break;

		case GD_BILINEAR_FIXED:
		case GD_LINEAR:
			im_scaled = gdImageScaleBilinear(src, new_width, new_height);
			break;

		case GD_BICUBIC_FIXED:
		case GD_BICUBIC:
			im_scaled = gdImageScaleBicubicFixed(src, new_width, new_height);
			break;

		/* generic */
		default:
			if (src->interpolation == NULL) {
				return NULL;
			}
			im_scaled = gdImageScaleTwoPass(src, new_width, new_height);
			break;
	}

	return im_scaled;
}